

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O2

void resize(lua_State *L,Table *t,int nasize,int nhsize)

{
  byte bVar1;
  int iVar2;
  Node *block;
  Node *pNVar3;
  size_t nsize;
  TValue *pTVar4;
  TValue *pTVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int key;
  ulong uVar9;
  
  iVar2 = t->sizearray;
  bVar1 = t->lsizenode;
  block = t->node;
  if (iVar2 < nasize) {
    setarrayvector(L,t,nasize);
  }
  setnodevector(L,t,nhsize);
  if (nasize < iVar2) {
    t->sizearray = nasize;
    lVar8 = (long)nasize;
    key = nasize + 1;
    nsize = lVar8 * 0x10;
    lVar6 = nsize + 8;
    for (; lVar8 < iVar2; lVar8 = lVar8 + 1) {
      pTVar5 = t->array;
      if (*(int *)((long)&pTVar5->value + lVar6) != 0) {
        pTVar4 = luaH_setnum(L,t,key);
        pTVar4->value = *(Value *)((long)pTVar5 + lVar6 + -8);
        pTVar4->tt = *(int *)((long)&pTVar5->value + lVar6);
      }
      key = key + 1;
      lVar6 = lVar6 + 0x10;
    }
    if (nasize < -1) {
      pTVar5 = (TValue *)luaM_toobig(L);
    }
    else {
      pTVar5 = (TValue *)luaM_realloc_(L,t->array,(long)iVar2 << 4,nsize);
    }
    t->array = pTVar5;
  }
  uVar9 = 1L << (bVar1 & 0x3f);
  uVar7 = uVar9 & 0xffffffff;
  pNVar3 = block + uVar9;
  while( true ) {
    if ((int)uVar7 < 1) break;
    if (pNVar3[-1].i_val.tt != 0) {
      pTVar5 = luaH_set(L,t,&pNVar3[-1].i_key.tvk);
      pTVar5->value = pNVar3[-1].i_val.value;
      pTVar5->tt = pNVar3[-1].i_val.tt;
    }
    uVar7 = (ulong)((int)uVar7 - 1);
    pNVar3 = pNVar3 + -1;
  }
  if (block != &dummynode_) {
    luaM_realloc_(L,block,(long)(int)uVar9 * 0x28,0);
    return;
  }
  return;
}

Assistant:

static void resize (lua_State *L, Table *t, int nasize, int nhsize) {
  int i;
  int oldasize = t->sizearray;
  int oldhsize = t->lsizenode;
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  setnodevector(L, t, nhsize);  
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        setobjt2t(L, luaH_setnum(L, t, i+1), &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (i = twoto(oldhsize) - 1; i >= 0; i--) {
    Node *old = nold+i;
    if (!ttisnil(gval(old)))
      setobjt2t(L, luaH_set(L, t, key2tval(old)), gval(old));
  }
  if (nold != dummynode)
    luaM_freearray(L, nold, twoto(oldhsize), Node);  /* free old array */
}